

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool SpeedSPAKE2(string *selected)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  SPAKE2_CTX *__p;
  pointer ctx;
  allocator<char> local_c1;
  string local_c0;
  anon_class_16_2_c0a905ff local_a0;
  function<bool_()> local_90;
  undefined4 local_70;
  size_t local_60;
  size_t alice_msg_len;
  uint8_t alice_msg [32];
  unique_ptr<spake2_ctx_st,_bssl::internal::Deleter> local_30;
  UniquePtr<SPAKE2_CTX> alice;
  TimeResults results;
  string *selected_local;
  
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (lVar4 = std::__cxx11::string::find((char *)selected,0x329044), lVar4 == -1)) {
    selected_local._7_1_ = true;
  }
  else {
    __p = SPAKE2_CTX_new(spake2_role_alice,"A",1,"B",1);
    std::unique_ptr<spake2_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<spake2_ctx_st,bssl::internal::Deleter> *)&local_30,__p);
    ctx = std::unique_ptr<spake2_ctx_st,_bssl::internal::Deleter>::get(&local_30);
    iVar2 = SPAKE2_generate_msg(ctx,(uint8_t *)&alice_msg_len,&local_60,0x20,"password",9);
    if (iVar2 == 0) {
      fprintf(_stderr,"SPAKE2_generate_msg failed.\n");
      selected_local._7_1_ = false;
    }
    else {
      local_a0.alice_msg = (uint8_t (*) [32])&alice_msg_len;
      local_a0.alice_msg_len = local_60;
      std::function<bool()>::function<SpeedSPAKE2(std::__cxx11::string_const&)::__0,void>
                ((function<bool()> *)&local_90,&local_a0);
      bVar1 = TimeFunctionParallel((TimeResults *)&alice,&local_90);
      std::function<bool_()>::~function(&local_90);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        fprintf(_stderr,"SPAKE2 failed.\n");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"SPAKE2 over Ed25519",&local_c1);
      TimeResults::Print((TimeResults *)&alice,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      selected_local._7_1_ = true;
    }
    local_70 = 1;
    std::unique_ptr<spake2_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  }
  return selected_local._7_1_;
}

Assistant:

static bool SpeedSPAKE2(const std::string &selected) {
  if (!selected.empty() && selected.find("SPAKE2") == std::string::npos) {
    return true;
  }

  TimeResults results;

  static const uint8_t kAliceName[] = {'A'};
  static const uint8_t kBobName[] = {'B'};
  static const uint8_t kPassword[] = "password";
  bssl::UniquePtr<SPAKE2_CTX> alice(
      SPAKE2_CTX_new(spake2_role_alice, kAliceName, sizeof(kAliceName),
                     kBobName, sizeof(kBobName)));
  uint8_t alice_msg[SPAKE2_MAX_MSG_SIZE];
  size_t alice_msg_len;

  if (!SPAKE2_generate_msg(alice.get(), alice_msg, &alice_msg_len,
                           sizeof(alice_msg), kPassword, sizeof(kPassword))) {
    fprintf(stderr, "SPAKE2_generate_msg failed.\n");
    return false;
  }

  if (!TimeFunctionParallel(&results, [&alice_msg, alice_msg_len]() -> bool {
        bssl::UniquePtr<SPAKE2_CTX> bob(
            SPAKE2_CTX_new(spake2_role_bob, kBobName, sizeof(kBobName),
                           kAliceName, sizeof(kAliceName)));
        uint8_t bob_msg[SPAKE2_MAX_MSG_SIZE], bob_key[64];
        size_t bob_msg_len, bob_key_len;
        if (!SPAKE2_generate_msg(bob.get(), bob_msg, &bob_msg_len,
                                 sizeof(bob_msg), kPassword,
                                 sizeof(kPassword)) ||
            !SPAKE2_process_msg(bob.get(), bob_key, &bob_key_len,
                                sizeof(bob_key), alice_msg, alice_msg_len)) {
          return false;
        }

        return true;
      })) {
    fprintf(stderr, "SPAKE2 failed.\n");
  }

  results.Print("SPAKE2 over Ed25519");

  return true;
}